

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_laplace.cpp
# Opt level: O2

Reals __thiscall
Omega_h::solve_laplacian(Omega_h *this,Mesh *mesh,Reals *initial,Int width,Real tol,Real floor)

{
  Alloc *pAVar1;
  bool bVar2;
  LO LVar3;
  Int class_dim;
  I32 IVar4;
  ostream *poVar5;
  void *extraout_RDX;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  Reals RVar9;
  undefined8 uStack_250;
  int local_22c;
  Reals new_state;
  Write<double> new_state_w;
  Read<double> bc_data;
  LOs b2v;
  CommPtr comm;
  Write<double> local_1b0;
  Write<int> local_1a0;
  Write<signed_char> local_190;
  Reals weights;
  Write<signed_char> local_170;
  Write<signed_char> local_160;
  Read<signed_char> boundary;
  Read<signed_char> interior;
  Write<double> local_130;
  undefined1 local_120 [64];
  Write<double> local_e0;
  Write<double> local_d0;
  Reals new_state_nobc;
  Graph star;
  Write<double> local_90;
  Write<double> local_80;
  Write<double> local_70;
  Write<double> local_60;
  Graph local_50;
  
  bVar2 = Mesh::owners_have_all_upward(mesh,0);
  if (bVar2) {
    pAVar1 = (initial->write_).shared_alloc_.alloc;
    if (((ulong)pAVar1 & 1) == 0) {
      sVar7 = pAVar1->size;
    }
    else {
      sVar7 = (ulong)pAVar1 >> 3;
    }
    LVar3 = Mesh::nverts(mesh);
    if (LVar3 * width == (int)(sVar7 >> 3)) {
      Mesh::comm((Mesh *)&comm);
      Write<double>::Write((Write<double> *)this,&initial->write_);
      Mesh::ask_star(&star,mesh,0);
      class_dim = Mesh::dim(mesh);
      mark_by_class_dim((Omega_h *)&interior,mesh,0,class_dim);
      Write<signed_char>::Write(&local_160,&interior.write_);
      invert_marks((Omega_h *)&boundary,(Read<signed_char> *)&local_160);
      Write<signed_char>::~Write(&local_160);
      Write<signed_char>::Write(&local_170,&boundary.write_);
      collect_marked((Omega_h *)&b2v,(Read<signed_char> *)&local_170);
      Write<signed_char>::~Write(&local_170);
      if (((ulong)star.ab2b.write_.shared_alloc_.alloc & 1) == 0) {
        uVar8 = (star.ab2b.write_.shared_alloc_.alloc)->size;
      }
      else {
        uVar8 = (ulong)star.ab2b.write_.shared_alloc_.alloc >> 3;
      }
      std::__cxx11::string::string((string *)&new_state,"",(allocator *)&bc_data);
      Read<double>::Read(&weights,(LO)(uVar8 >> 2),1.0,(string *)&new_state);
      std::__cxx11::string::~string((string *)&new_state);
      Write<int>::Write(&local_1a0,&b2v.write_);
      Write<double>::Write(&local_1b0,&initial->write_);
      unmap<double>((Omega_h *)&local_190,(LOs *)&local_1a0,(Read<signed_char> *)&local_1b0,width);
      read<double>((Omega_h *)&bc_data,&local_190);
      Write<double>::~Write((Write<double> *)&local_190);
      Write<double>::~Write(&local_1b0);
      Write<int>::~Write(&local_1a0);
      local_22c = 0;
      do {
        Graph::Graph(&local_50,&star);
        Write<double>::Write(&local_d0,&weights.write_);
        Write<double>::Write(&local_e0,(Write<double> *)this);
        graph_weighted_average
                  ((Omega_h *)&new_state_nobc,&local_50,(Reals *)&local_d0,(Reals *)&local_e0,width)
        ;
        Write<double>::~Write(&local_e0);
        Write<double>::~Write(&local_d0);
        Graph::~Graph(&local_50);
        Write<double>::Write((Write<double> *)(local_120 + 0x30),(Write<double> *)&new_state_nobc);
        std::__cxx11::string::string((string *)&new_state,"",(allocator *)local_120);
        deep_copy<double>((Omega_h *)&new_state_w,(Read<signed_char> *)(local_120 + 0x30),
                          (string *)&new_state);
        std::__cxx11::string::~string((string *)&new_state);
        Write<double>::~Write((Write<double> *)(local_120 + 0x30));
        Write<double>::Write((Write<double> *)(local_120 + 0x20),&bc_data.write_);
        Write<int>::Write((Write<int> *)(local_120 + 0x10),&b2v.write_);
        Write<double>::Write(&local_60,&new_state_w);
        map_into<double>((Read<signed_char> *)(local_120 + 0x20),(LOs *)(local_120 + 0x10),
                         (Write<signed_char> *)&local_60,width);
        Write<double>::~Write(&local_60);
        Write<int>::~Write((Write<int> *)(local_120 + 0x10));
        Write<double>::~Write((Write<double> *)(local_120 + 0x20));
        Write<double>::Write(&local_70,&new_state_w);
        Read<double>::Read((Read<signed_char> *)&new_state,&local_70);
        Write<double>::~Write(&local_70);
        Write<double>::Write(&local_80,(Write<double> *)&new_state);
        Mesh::sync_array<double>((Mesh *)local_120,(Int)mesh,(Read<double> *)0x0,(Int)&local_80);
        Write<double>::operator=(&new_state.write_,(Write<signed_char> *)local_120);
        Write<double>::~Write((Write<double> *)local_120);
        Write<double>::~Write(&local_80);
        Write<double>::Write(&local_130,(Write<double> *)this);
        Write<double>::Write(&local_90,&new_state.write_);
        bVar2 = are_close((Reals *)&local_130,(Reals *)&local_90,tol,floor);
        Write<double>::~Write(&local_90);
        Write<double>::~Write(&local_130);
        bVar2 = Comm::reduce_and(comm.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,bVar2);
        Write<double>::operator=((Write<double> *)this,&new_state.write_);
        local_22c = local_22c + 1;
        Write<double>::~Write(&new_state.write_);
        Write<double>::~Write(&new_state_w);
        Write<double>::~Write(&new_state_nobc.write_);
      } while (!bVar2);
      IVar4 = Comm::rank(comm.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if (IVar4 == 0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"laplacian solve took ");
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,local_22c);
        std::operator<<(poVar5," iterations\n");
      }
      Write<double>::~Write(&bc_data.write_);
      Write<double>::~Write(&weights.write_);
      Write<int>::~Write(&b2v.write_);
      Write<signed_char>::~Write(&boundary.write_);
      Write<signed_char>::~Write(&interior.write_);
      Graph::~Graph(&star);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&comm.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      RVar9.write_.shared_alloc_.direct_ptr = extraout_RDX;
      RVar9.write_.shared_alloc_.alloc = (Alloc *)this;
      return (Reals)RVar9.write_.shared_alloc_;
    }
    pcVar6 = "initial.size() == mesh->nverts() * width";
    uStack_250 = 0x10;
  }
  else {
    pcVar6 = "mesh->owners_have_all_upward(VERT)";
    uStack_250 = 0xf;
  }
  fail("assertion %s failed at %s +%d\n",pcVar6,
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_laplace.cpp"
       ,uStack_250);
}

Assistant:

Reals solve_laplacian(
    Mesh* mesh, Reals initial, Int width, Real tol, Real floor) {
  OMEGA_H_CHECK(mesh->owners_have_all_upward(VERT));
  OMEGA_H_CHECK(initial.size() == mesh->nverts() * width);
  auto comm = mesh->comm();
  auto state = initial;
  auto star = mesh->ask_star(VERT);
  auto interior = mark_by_class_dim(mesh, VERT, mesh->dim());
  auto boundary = invert_marks(interior);
  auto b2v = collect_marked(boundary);
  auto weights = Reals(star.ab2b.size(), 1.0);
  auto bc_data = read(unmap(b2v, initial, width));
  bool done = false;
  Int niters = 0;
  do {
    auto new_state_nobc = graph_weighted_average(star, weights, state, width);
    auto new_state_w = deep_copy(new_state_nobc);
    map_into(bc_data, b2v, new_state_w, width);
    auto new_state = Reals(new_state_w);
    new_state = mesh->sync_array(VERT, new_state, width);
    auto local_done = are_close(state, new_state, tol, floor);
    done = comm->reduce_and(local_done);
    state = new_state;
    ++niters;
  } while (!done);
  if (comm->rank() == 0) {
    std::cout << "laplacian solve took " << niters << " iterations\n";
  }
  return state;
}